

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::RecordSet::Encode(RecordSet *this,KDataStream *stream)

{
  KUOCTET *pKVar1;
  KUOCTET *pKVar2;
  
  KDataStream::Write<unsigned_int>(stream,this->m_ui32RecID);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32RecSetSerialNum);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16RecLen);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16RecCnt);
  pKVar1 = (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->m_vui8RecVals).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    KDataStream::Write(stream,*pKVar2);
  }
  return;
}

Assistant:

void RecordSet::Encode( KDataStream & stream ) const
{
    stream << m_ui32RecID
           << m_ui32RecSetSerialNum
           << m_ui16RecLen
           << m_ui16RecCnt;

    vector<KUINT8>::const_iterator citr = m_vui8RecVals.begin();
    vector<KUINT8>::const_iterator citrEnd = m_vui8RecVals.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }
}